

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

int xmlRegAtomPush(xmlRegParserCtxtPtr ctxt,xmlRegAtomPtr atom)

{
  uint uVar1;
  xmlRegAtomPtr *ppxVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = ctxt->maxAtoms;
  iVar3 = ctxt->nbAtoms;
  if (iVar3 < (int)uVar1) {
    ppxVar2 = ctxt->atoms;
LAB_0017b2ee:
    atom->no = iVar3;
    ctxt->nbAtoms = iVar3 + 1;
    ppxVar2[iVar3] = atom;
    iVar3 = 0;
  }
  else {
    if ((int)uVar1 < 1) {
      uVar5 = 4;
LAB_0017b2ca:
      ppxVar2 = (xmlRegAtomPtr *)(*xmlRealloc)(ctxt->atoms,(ulong)uVar5 << 3);
      if (ppxVar2 != (xmlRegAtomPtr *)0x0) {
        ctxt->atoms = ppxVar2;
        ctxt->maxAtoms = uVar5;
        iVar3 = ctxt->nbAtoms;
        goto LAB_0017b2ee;
      }
    }
    else if (uVar1 < 1000000000) {
      uVar4 = uVar1 + 1 >> 1;
      uVar5 = uVar4 + uVar1;
      if (1000000000 - uVar4 < uVar1) {
        uVar5 = 1000000000;
      }
      goto LAB_0017b2ca;
    }
    ctxt->error = 2;
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                        (xmlError *)0x0);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int
xmlRegAtomPush(xmlRegParserCtxtPtr ctxt, xmlRegAtomPtr atom) {
    if (atom == NULL) {
	ERROR("atom push: atom is NULL");
	return(-1);
    }
    if (ctxt->nbAtoms >= ctxt->maxAtoms) {
	xmlRegAtomPtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->maxAtoms, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
	if (newSize < 0) {
	    xmlRegexpErrMemory(ctxt);
	    return(-1);
	}
	tmp = xmlRealloc(ctxt->atoms, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    return(-1);
	}
	ctxt->atoms = tmp;
        ctxt->maxAtoms = newSize;
    }
    atom->no = ctxt->nbAtoms;
    ctxt->atoms[ctxt->nbAtoms++] = atom;
    return(0);
}